

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::Tick(AActor *this)

{
  double *pdVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  int *piVar4;
  char cVar5;
  AInventory *pAVar6;
  DBot *pDVar7;
  player_t *ppVar8;
  sector_t_conflict *sect;
  double dVar9;
  bool bVar10;
  AInventory *pAVar11;
  BYTE BVar12;
  bool bVar13;
  bool bVar14;
  short sVar15;
  uint uVar16;
  int iVar17;
  undefined4 extraout_var;
  AActor *pAVar18;
  long lVar19;
  sector_t_conflict *psVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  SDWORD SVar24;
  msecnode_t *pmVar25;
  FName *type;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  double dVar32;
  DVector2 v_2;
  DVector2 v;
  double local_d0;
  double local_c8;
  secplane_t local_a0;
  DVector3 local_78;
  double local_60;
  FName local_54;
  FName local_50;
  FName local_4c;
  DAngle local_48;
  DVector2 local_40;
  
  if (this->state == (FState *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar21 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar21);
    }
    Printf("Actor of type %s at (%f,%f) left without a state\n",(this->__Pos).X,
           SUB84((this->__Pos).Y,0),
           FName::NameData.NameArray
           [(((this->super_DThinker).super_DObject.Class)->super_PNativeStruct).super_PStruct.
            super_PNamedType.TypeName.Index].Text);
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
    return;
  }
  dVar26 = (this->__Pos).X;
  dVar29 = (this->__Pos).Y;
  (this->Prev).Z = (this->__Pos).Z;
  (this->Prev).X = dVar26;
  (this->Prev).Y = dVar29;
  (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
  dVar26 = (this->Angles).Yaw.Degrees;
  (this->PrevAngles).Pitch.Degrees = (this->Angles).Pitch.Degrees;
  (this->PrevAngles).Yaw.Degrees = dVar26;
  if (this->Sector == (sector_t *)0x0) {
    iVar21 = 0;
  }
  else {
    iVar21 = this->Sector->PortalGroup;
  }
  this->PrevPortalGroup = iVar21;
  uVar16 = (this->flags5).Value;
  if ((uVar16 >> 0x15 & 1) != 0) {
    if (((uVar16 >> 0x16 & 1) == 0) &&
       (((bglobal._16_1_ & 1) != 0 || (((byte)level.flags2 & 0x20) != 0)))) {
      if (((this->flags6).Value & 0x800000) == 0) {
        return;
      }
      this->special2 = this->special2 + 1;
      return;
    }
    dVar26 = (this->Vel).X;
    if (((((dVar26 != 0.0) || (NAN(dVar26))) || (dVar26 = (this->Vel).Y, dVar26 != 0.0)) ||
        ((NAN(dVar26) || (dVar26 = (this->Vel).Z, dVar26 != 0.0)))) ||
       ((NAN(dVar26) || (((this->flags).Value & 0x10) == 0)))) {
      local_78.X = 0.0;
      local_78.Y = 0.0;
      UnlinkFromWorld(this,(FLinkContext *)&local_78);
      *(byte *)&(this->flags).Value = (byte)(this->flags).Value | 0x10;
      dVar26 = (this->Vel).Z;
      P_GetOffsetPosition((this->__Pos).X,(this->__Pos).Y,(this->Vel).X,(this->Vel).Y);
      (this->__Pos).Z = dVar26 + (this->__Pos).Z;
      (this->__Pos).X = local_a0.normal.X;
      (this->__Pos).Y = local_a0.normal.Y;
      CheckPortalTransition(this,false);
      LinkToWorld(this,(FLinkContext *)&local_78,false,(sector_t *)0x0);
    }
    goto LAB_00425ff8;
  }
  pAVar6 = (this->Inventory).field_0.p;
  if ((pAVar6 != (AInventory *)0x0) &&
     (((pAVar6->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->Inventory).field_0.p = (AInventory *)0x0;
    pAVar6 = (AInventory *)0x0;
  }
  while (pAVar11 = pAVar6, pAVar11 != (AInventory *)0x0) {
    pAVar18 = (pAVar11->Owner).field_0.p;
    if ((pAVar18 != (AActor *)0x0) &&
       (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar11->Owner).field_0.p = (AActor *)0x0;
      pAVar18 = (AActor *)0x0;
    }
    if (pAVar18 != this) break;
    (*(pAVar11->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x27])(pAVar11);
    pAVar6 = (pAVar11->super_AActor).Inventory.field_0.p;
    if ((pAVar6 != (AInventory *)0x0) &&
       (((pAVar6->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar11->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      pAVar6 = (AInventory *)0x0;
    }
  }
  if (((this->flags).Value & 0x10000000) != 0) {
    return;
  }
  if (((this->flags5).Value & 0x400000) == 0) {
    if (((this->flags6).Value & 0x800000) != 0) {
      this->special2 = this->special2 + 1;
    }
    if ((bglobal._16_1_ & 1) != 0) {
      ppVar8 = this->player;
      if (ppVar8 == (player_t *)0x0) {
        return;
      }
      pDVar7 = (ppVar8->Bot).field_0.p;
      if (pDVar7 != (DBot *)0x0) {
        if (((pDVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          return;
        }
        (ppVar8->Bot).field_0.p = (DBot *)0x0;
      }
    }
    if (((byte)level.flags2 & 0x20) != 0) {
      if (this->player == (player_t *)0x0) {
        return;
      }
      if (this->player->timefreezer == 0) {
        return;
      }
    }
  }
  if ((this->effects & 1) == 0) {
    if (((this->effects & 2) != 0) &&
       (BVar12 = this->smokecounter + '\x01', this->smokecounter = BVar12, BVar12 == '\b')) {
      this->smokecounter = '\0';
      dVar26 = c_atan2((this->Vel).Y,(this->Vel).X);
      dVar26 = FFastTrig::cos(&fasttrig,
                              dVar26 * 57.29577951308232 * 11930464.711111112 + 6755399441055744.0);
      dVar26 = dVar26 * this->radius;
      uVar16 = FRandom::GenRand32(&pr_rockettrail);
      dVar27 = (double)(uVar16 & 0xff) * 0.015625 - (dVar26 + dVar26);
      dVar28 = FFastTrig::sin(&fasttrig,dVar27);
      dVar28 = dVar28 * this->radius;
      uVar16 = FRandom::GenRand32(&pr_rockettrail);
      dVar26 = this->Height;
      dVar29 = (this->Vel).Z;
      local_50.Index = FName::NameManager::FindName(&FName::NameData,"GrenadeSmokeTrail",false);
      type = &local_50;
      P_GetOffsetPosition((this->__Pos).X,(this->__Pos).Y,dVar27,
                          (double)(uVar16 & 0xff) * 0.015625 - (dVar28 + dVar28));
      local_a0.normal.Z = dVar26 * 0.6666666666666666 + dVar29 * dVar26 * -0.125 + (this->__Pos).Z;
LAB_00426110:
      local_a0.normal.X = local_78.X;
      local_a0.normal.Y = local_78.Y;
      pAVar18 = Spawn(type,&local_a0.normal,ALLOW_REPLACE);
      if (pAVar18 != (AActor *)0x0) {
        uVar16 = FRandom::GenRand32(&pr_rockettrail);
        iVar21 = pAVar18->tics - (uVar16 & 3);
        SVar24 = 1;
        if (1 < iVar21) {
          SVar24 = iVar21;
        }
        pAVar18->tics = SVar24;
        if (((byte)cl_rockettrails.Value & 2) == 0) {
          pbVar2 = (byte *)((long)&(pAVar18->renderflags).Value + 1);
          *pbVar2 = *pbVar2 | 0x80;
        }
      }
    }
  }
  else {
    BVar12 = this->smokecounter + '\x01';
    this->smokecounter = BVar12;
    if (BVar12 == '\x04') {
      this->smokecounter = '\0';
      local_4c.Index = FName::NameManager::FindName(&FName::NameData,"RocketSmokeTrail",false);
      type = &local_4c;
      dVar26 = (this->Vel).Z;
      P_GetOffsetPosition((this->__Pos).X,(this->__Pos).Y,-(this->Vel).X,-(this->Vel).Y);
      local_a0.normal.Z = (this->__Pos).Z - dVar26;
      goto LAB_00426110;
    }
  }
  uVar16 = (this->flags4).Value;
  if (((uVar16 >> 0x17 & 1) != 0) && (0 < this->health)) {
    dVar26 = (this->Vel).Z;
    if (0.25 <= ABS(dVar26)) {
      (this->Vel).Z = dVar26 * 0.90625;
    }
    else {
      (this->Vel).Z = 0.0;
      (this->flags4).Value = uVar16 & 0xff7fffff;
    }
  }
  if ((this->effects & 0x40) == 0) {
    if (((this->flags).Value & 0x40000000) != 0) {
      puVar3 = &(this->RenderStyle).field_0.Flags;
      *puVar3 = *puVar3 & 0xfd;
      if (this->visdir < '\x01') {
        if ((this->visdir < '\0') &&
           (dVar26 = this->Alpha + -0.04285714285714286, this->Alpha = dVar26, dVar26 < 0.0)) {
          this->Alpha = 0.0;
          goto LAB_0042631b;
        }
      }
      else {
        dVar26 = this->Alpha + 0.05714285714285714;
        this->Alpha = dVar26;
        if (1.0 < dVar26) {
          this->Alpha = 1.0;
LAB_0042631b:
          this->visdir = '\0';
        }
      }
    }
  }
  else if (this->visdir < '\x01') {
    dVar26 = this->Alpha + -0.03125;
    this->Alpha = dVar26;
    if (dVar26 <= 0.25) {
      this->Alpha = 0.25;
      this->visdir = '\x01';
    }
  }
  else {
    dVar26 = this->Alpha + 0.03125;
    this->Alpha = dVar26;
    if (1.0 <= dVar26) {
      this->Alpha = 1.0;
      this->visdir = -1;
    }
  }
  if (((bglobal.botnum != 0) && (demoplayback == false)) &&
     ((((this->flags).Value & 0x10001) != 0 || (((this->flags3).Value & 0x2000) != 0)))) {
    FCajunMaster::BotTick(&bglobal,this);
  }
  local_d0 = 0.0;
  if ((level.Scrolls.Count == 0) && (this->player == (player_t *)0x0)) {
    local_c8 = 0.0;
  }
  else {
    local_c8 = 0.0;
    if (((this->flags).Value & 0x1008) == 0) {
      pmVar25 = this->touching_sectorlist;
      if (pmVar25 == (msecnode_t *)0x0) {
        iVar17 = 0;
        local_d0 = 0.0;
        local_c8 = 0.0;
        iVar21 = 0;
      }
      else {
        iVar21 = 0;
        local_c8 = 0.0;
        local_d0 = 0.0;
        iVar17 = 0;
        do {
          sect = pmVar25->m_sector;
          lVar19 = (long)sect - (long)sectors >> 3;
          dVar29 = 0.0;
          dVar26 = 0.0;
          if ((uint)((int)lVar19 * 0x7a44c6b) < level.Scrolls.Count) {
            dVar26 = level.Scrolls.Array[lVar19 * 0xb7672a07a44c6b].X;
            dVar29 = level.Scrolls.Array[lVar19 * 0xb7672a07a44c6b].Y;
          }
          if (this->player != (player_t *)0x0) {
            sVar15 = sect->special;
            iVar22 = (int)sVar15;
            uVar16 = iVar22 - 0xc9;
            if ((ushort)uVar16 < 0x18) {
              if ((i_compatflags._1_1_ & 4) == 0) {
                uVar30 = 0;
                uVar31 = 0x3fe00000;
                dVar27 = (double)(int)Tick::HexenScrollies[uVar16][0] * 0.5;
                cVar5 = Tick::HexenScrollies[uVar16][1];
              }
              else {
                uVar30 = 0x55555555;
                uVar31 = 0x3fd55555;
                dVar27 = (double)(int)Tick::HexenCompatSpeeds
                                      [(long)Tick::HexenScrollies[uVar16][0] + 4] *
                         0.3333333333333333;
                cVar5 = Tick::HexenCompatSpeeds[(long)Tick::HexenScrollies[uVar16][1] + 4];
              }
              dVar26 = dVar26 - dVar27;
              dVar29 = dVar29 + (double)(int)cVar5 * (double)CONCAT44(uVar31,uVar30);
            }
            else {
              uVar16 = iVar22 - 0xe1;
              if ((ushort)uVar16 < 0x14) {
                iVar23 = (uVar16 / 5) * -5 + iVar22;
                dVar27 = (double)"\x05\n\x19\x1e#"[iVar23 - 0xe1] * 0.3333333333333333;
                if ((iVar22 < 0xe6) && ((i_compatflags._1_1_ & 4) == 0)) {
                  dVar27 = (double)(((ulong)(iVar23 - 0xd2) << 0x34) + 0x3ef0000000000000);
                }
                dVar26 = dVar26 + (double)(int)(("\x06\t\x01\x04"[(ulong)uVar16 / 5] & 3) - 1) *
                                  dVar27;
                dVar29 = dVar29 + (double)(int)(("\x06\t\x01\x04"[(ulong)uVar16 / 5] >> 2 & 3) - 1)
                                  * dVar27;
              }
              else if (sVar15 == 0x76) {
                iVar23 = FTagManager::GetFirstSectorTag(&tagManager,(sector_t *)sect);
                iVar22 = (iVar23 + -100) / 10;
                local_78.X = (double)iVar22 * 45.0;
                TAngle<double>::ToVector
                          ((TAngle<double> *)&local_a0,(double)(iVar23 + iVar22 * -10 + -100) / 1.5)
                ;
                dVar26 = dVar26 + local_a0.normal.X;
                dVar29 = dVar29 + local_a0.normal.Y;
              }
              else if (sVar15 == 0x54) {
                if ((i_compatflags._1_1_ & 4) == 0) {
                  dVar26 = dVar26 + 4.0;
                }
                else {
                  dVar26 = dVar26 + 9.333333333333334;
                }
              }
            }
          }
          if (((((dVar26 != 0.0) || (NAN(dVar26))) || (dVar29 != 0.0)) || (NAN(dVar29))) &&
             ((psVar20 = sector_t::GetHeightSec((sector_t *)sect),
              psVar20 != (sector_t_conflict *)0x0 || (((this->flags).Value & 0x200) == 0)))) {
            iVar22 = this->Sector->PortalGroup;
            uVar30 = 0;
            uVar31 = 0;
            dVar27 = 0.0;
            if (iVar22 != sect->PortalGroup) {
              iVar22 = sect->PortalGroup * Displacements.size + iVar22;
              dVar27 = Displacements.data.Array[iVar22].pos.X;
              uVar30 = SUB84(dVar27,0);
              uVar31 = (undefined4)((ulong)dVar27 >> 0x20);
              dVar27 = Displacements.data.Array[iVar22].pos.Y;
            }
            dVar9 = (double)CONCAT44(uVar31,uVar30) + (this->__Pos).X;
            dVar27 = dVar27 + (this->__Pos).Y;
            dVar32 = ((sect->floorplane).normal.Y * dVar27 +
                     (sect->floorplane).normal.X * dVar9 + (sect->floorplane).D) *
                     (sect->floorplane).negiC;
            dVar28 = (this->__Pos).Z;
            if ((dVar28 <= dVar32 + 1.52587890625e-05) ||
               ((psVar20 != (sector_t_conflict *)0x0 &&
                ((dVar27 = (dVar27 * (psVar20->floorplane).normal.Y +
                           dVar9 * (psVar20->floorplane).normal.X + (psVar20->floorplane).D) *
                           (psVar20->floorplane).negiC, dVar27 <= dVar32 || (dVar28 < dVar27)))))) {
              local_d0 = local_d0 + dVar26;
              local_c8 = local_c8 + dVar29;
              iVar21 = iVar21 + (uint)(dVar26 != 0.0);
              iVar17 = iVar17 + (uint)(dVar29 != 0.0);
            }
          }
          pmVar25 = pmVar25->m_tnext;
        } while (pmVar25 != (msecnode_t *)0x0);
      }
      if ((this->player != (player_t *)0x0) || ((i_compatflags._1_1_ & 0x80) == 0)) {
        if (1 < iVar21) {
          local_d0 = local_d0 / (double)iVar21;
        }
        if (1 < iVar17) {
          local_c8 = local_c8 / (double)iVar17;
        }
      }
    }
  }
  if ((((this->flags).Value & 0x1212) == 2) && ((this->Vel).Z <= 0.0)) {
    dVar26 = this->floorz;
    pdVar1 = &(this->__Pos).Z;
    if ((dVar26 == *pdVar1) && (!NAN(dVar26) && !NAN(*pdVar1))) {
      local_78.X = (this->__Pos).X;
      local_78.Y = (this->__Pos).Y;
      local_78.Z = dVar26;
      P_FindFloorPlane(&local_a0,(sector_t_conflict *)this->floorsector,&local_78);
      dVar29 = local_a0.normal.Y;
      dVar26 = local_a0.normal.X;
      if (local_a0.normal.Z < 0.707122802734375) {
        local_60 = local_a0.normal.Z;
        PosRelative(&local_a0.normal,this,this->floorsector);
        if ((local_a0.normal.Y * dVar29 + local_a0.normal.X * dVar26 + local_a0.D) * local_a0.negiC
            <= this->floorz) {
          if ((0.4714152018229167 < local_60) &&
             (pmVar25 = this->touching_sectorlist, pmVar25 != (msecnode_t *)0x0)) {
            bVar14 = true;
            do {
              if ((pmVar25->m_sector->floorplane).normal.Z < 0.707122802734375) {
LAB_004265fb:
                bVar10 = true;
                bVar13 = bVar14;
              }
              else {
                PosRelative(&local_a0.normal,this,(sector_t *)pmVar25->m_sector);
                bVar10 = false;
                bVar13 = false;
                if ((local_a0.normal.Y * dVar29 + local_a0.normal.X * dVar26 + local_a0.D) *
                    local_a0.negiC < (this->__Pos).Z - this->MaxStepHeight) goto LAB_004265fb;
              }
            } while ((bVar10) &&
                    (pmVar25 = pmVar25->m_tnext, bVar14 = bVar13, pmVar25 != (msecnode_t *)0x0));
            if (!bVar13) goto LAB_00426640;
          }
          (this->Vel).X = dVar26 + (this->Vel).X;
          (this->Vel).Y = dVar29 + (this->Vel).Y;
        }
      }
    }
  }
LAB_00426640:
  if ((((((this->flags).Value & 0x10000) != 0) && (dVar26 = (this->Vel).X, dVar26 == 0.0)) &&
      (!NAN(dVar26))) &&
     (((dVar26 = (this->Vel).Y, dVar26 == 0.0 && (!NAN(dVar26))) &&
      ((this->DamageVal != 0 || (this->DamageFunc != (VMFunction *)0x0)))))) {
    (this->Vel).X = 1.52587890625e-05;
  }
  this->BlockingMobj = (AActor *)0x0;
  local_40.X = local_d0;
  local_40.Y = local_c8;
  dVar26 = P_XYMovement(this,&local_40);
  if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    return;
  }
  dVar29 = (this->Vel).X;
  if (((dVar29 == 0.0) && (!NAN(dVar29))) &&
     ((dVar29 = (this->Vel).Y, dVar29 == 0.0 && (!NAN(dVar29))))) {
    uVar16 = (this->flags2).Value;
    if ((uVar16 & 8) != 0) {
      (this->flags2).Value = uVar16 & 0xfffffff7;
    }
    uVar16 = (this->flags6).Value;
    if (((uVar16 >> 9 & 1) != 0) && ((this->health < 1 || (this->SeeState == (FState *)0x0)))) {
      (this->flags6).Value = uVar16 | 0x2000;
    }
  }
  dVar29 = (this->Vel).Z;
  if (((dVar29 != 0.0) || (NAN(dVar29))) || (this->BlockingMobj != (AActor *)0x0)) {
LAB_0042671b:
    if (((((this->flags2).Value & 0x1000) == 0) && (((this->flags).Value & 1) == 0)) ||
       (((byte)i_compatflags & 0x10) != 0)) {
      P_ZMovement(this,dVar26);
    }
    else {
      pAVar18 = P_CheckOnmobj(this);
      if (pAVar18 == (AActor *)0x0) {
        P_ZMovement(this,dVar26);
        pbVar2 = (byte *)((long)&(this->flags2).Value + 1);
        *pbVar2 = *pbVar2 & 0xf7;
      }
      else {
        if (((this->player != (player_t *)0x0) &&
            (dVar26 = level.gravity * this->Sector->gravity * -0.01, pdVar1 = &(this->Vel).Z,
            *pdVar1 <= dVar26 && dVar26 != *pdVar1)) && (((this->flags).Value & 0x200) == 0)) {
          PlayerLandedOnThing(this,pAVar18);
        }
        dVar29 = (pAVar18->__Pos).Z + pAVar18->Height;
        dVar26 = dVar29 - (this->__Pos).Z;
        if (dVar26 <= this->MaxStepHeight) {
          ppVar8 = this->player;
          if ((ppVar8 != (player_t *)0x0) && (ppVar8->mo == (APlayerPawn *)this)) {
            dVar26 = ppVar8->viewheight - dVar26;
            ppVar8->viewheight = dVar26;
            dVar26 = ((ppVar8->mo->ViewHeight + ppVar8->crouchviewdelta) - dVar26) * 0.125;
            if (ppVar8->deltaviewheight <= dVar26 && dVar26 != ppVar8->deltaviewheight) {
              ppVar8->deltaviewheight = dVar26;
            }
          }
          (this->__Pos).Z = dVar29;
        }
        if ((((pAVar18->flags6).Value & 0x20) != 0) &&
           ((((ppVar8 = this->player, ppVar8 != (player_t *)0x0 ||
              (((pAVar18->activationtype & 8U) != 0 && (((this->flags3).Value & 0x2000) != 0)))) ||
             (((pAVar18->activationtype & 0x10U) != 0 && (((this->flags).Value & 0x10000) != 0))))
            && ((pAVar18->lastbump < level.maptime &&
                (((ppVar8 == (player_t *)0x0 || ((ppVar8->cheats & 0x2000) == 0)) &&
                 (bVar14 = P_ActivateThingSpecial(pAVar18,this,false), bVar14)))))))) {
          pAVar18->lastbump = level.maptime + 0x23;
        }
        dVar26 = (this->Vel).Z;
        if (((dVar26 == 0.0) && (!NAN(dVar26))) || (((this->BounceFlags).Value & 8) == 0)) {
          pbVar2 = (byte *)((long)&(this->flags2).Value + 1);
          *pbVar2 = *pbVar2 | 8;
          (this->Vel).Z = 0.0;
          goto LAB_00426e08;
        }
        P_BounceActor(this,pAVar18,true);
      }
    }
LAB_00426e22:
    if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      return;
    }
  }
  else {
    dVar29 = (this->__Pos).Z;
    dVar27 = this->floorz;
    if ((dVar29 != dVar27) || (NAN(dVar29) || NAN(dVar27))) goto LAB_0042671b;
    if (dVar29 <= dVar27) {
LAB_00426e08:
      Crash(this);
      goto LAB_00426e22;
    }
  }
  CheckPortalTransition(this,true);
  (*(this->super_DThinker).super_DObject._vptr_DObject[0x19])(this,1);
  if ((this->player != (player_t *)0x0) && ((this->player->cheats & 0x2000) != 0)) {
    return;
  }
  if (this->PoisonDurationReceived != 0) {
    iVar21 = 0x23;
    if (this->PoisonPeriodReceived != 0) {
      iVar21 = this->PoisonPeriodReceived;
    }
    if (level.time % iVar21 == 0) {
      pAVar18 = (this->Poisoner).field_0.p;
      if ((pAVar18 != (AActor *)0x0) &&
         (((pAVar18->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->Poisoner).field_0.p = (AActor *)0x0;
        pAVar18 = (AActor *)0x0;
      }
      iVar21 = (this->PoisonDamageTypeReceived).super_FName.Index;
      local_54.Index = 0xc6;
      if (iVar21 != 0) {
        local_54.Index = iVar21;
      }
      local_48.Degrees = 0.0;
      P_DamageMobj(this,(AActor *)0x0,pAVar18,this->PoisonDamageReceived,&local_54,0,&local_48);
      piVar4 = &this->PoisonDurationReceived;
      *piVar4 = *piVar4 + -1;
      if (*piVar4 == 0) {
        this->PoisonDamageReceived = 0;
      }
    }
  }
LAB_00425ff8:
  if (this->state != (FState *)0x0) {
    bVar14 = CheckNoDelay(this);
    if (bVar14) {
      UpdateRenderSectorList(this);
      iVar21 = this->tics;
      if (iVar21 == -1) {
        iVar21 = G_SkillProperty(SKILLP_Respawn);
        uVar16 = (this->flags5).Value;
        if (((((uVar16 >> 0x11 & 1) != 0) ||
             ((((iVar21 != 0 && (((this->flags3).Value & 0x2000) != 0)) &&
               ((uVar16 & 0x40000) == 0 && ((this->flags2).Value & 0x10000000) == 0)) &&
              ((iVar17 = G_SkillProperty(SKILLP_RespawnLimit), iVar17 < 1 ||
               (this->skillrespawncount < iVar17)))))) &&
            (sVar15 = this->movecount + 1, this->movecount = sVar15, iVar21 <= sVar15)) &&
           (((level.time & 0x1fU) == 0 &&
            (uVar16 = FRandom::GenRand32(&pr_nightmarerespawn), (uVar16 & 0xff) < 5)))) {
          P_NightmareRespawn(this);
        }
      }
      else {
        this->tics = iVar21 + -1;
        if (iVar21 < 2) {
          SetState(this,this->state->NextState,false);
        }
      }
    }
    return;
  }
  __assert_fail("state != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1093,"virtual void AActor::Tick()");
}

Assistant:

void AActor::Tick ()
{
	// [RH] Data for Heretic/Hexen scrolling sectors
	static const SBYTE HexenCompatSpeeds[] = {-25, 0, -10, -5, 0, 5, 10, 0, 25 };
	static const SBYTE HexenScrollies[24][2] =
	{
		{  0,  1 }, {  0,  2 }, {  0,  4 },
		{ -1,  0 }, { -2,  0 }, { -4,  0 },
		{  0, -1 }, {  0, -2 }, {  0, -4 },
		{  1,  0 }, {  2,  0 }, {  4,  0 },
		{  1,  1 }, {  2,  2 }, {  4,  4 },
		{ -1,  1 }, { -2,  2 }, { -4,  4 },
		{ -1, -1 }, { -2, -2 }, { -4, -4 },
		{  1, -1 }, {  2, -2 }, {  4, -4 }
	};

	static const BYTE HereticScrollDirs[4] = { 6, 9, 1, 4 };
	static const BYTE HereticSpeedMuls[5] = { 5, 10, 25, 30, 35 };


	AActor *onmo;

	//assert (state != NULL);
	if (state == NULL)
	{
		Printf("Actor of type %s at (%f,%f) left without a state\n", GetClass()->TypeName.GetChars(), X(), Y());
		Destroy();
		return;
	}

	// This is necessary to properly interpolate movement outside this function
	// like from an ActorMover
	ClearInterpolation();

	if (flags5 & MF5_NOINTERACTION)
	{
		// only do the minimally necessary things here to save time:
		// Check the time freezer
		// apply velocity
		// ensure that the actor is not linked into the blockmap

		if (!(flags5 & MF5_NOTIMEFREEZE))
		{
			//Added by MC: Freeze mode.
			if (bglobal.freeze || level.flags2 & LEVEL2_FROZEN)
			{
				// Boss cubes shouldn't be accelerated by timefreeze
				if (flags6 & MF6_BOSSCUBE)
				{
					special2++;
				}
				return;
			}
		}

		if (!Vel.isZero() || !(flags & MF_NOBLOCKMAP))
		{
			FLinkContext ctx;
			UnlinkFromWorld(&ctx);
			flags |= MF_NOBLOCKMAP;
			SetXYZ(Vec3Offset(Vel));
			CheckPortalTransition(false);
			LinkToWorld(&ctx);
		}
	}
	else
	{
		AInventory * item = Inventory;

		// Handle powerup effects here so that the order is controlled
		// by the order in the inventory, not the order in the thinker table
		while (item != NULL && item->Owner == this)
		{
			item->DoEffect();
			item = item->Inventory;
		}

		if (flags & MF_UNMORPHED)
		{
			return;
		}

		if (!(flags5 & MF5_NOTIMEFREEZE))
		{
			// Boss cubes shouldn't be accelerated by timefreeze
			if (flags6 & MF6_BOSSCUBE)
			{
				special2++;
			}
			//Added by MC: Freeze mode.
			if (bglobal.freeze && !(player && player->Bot == NULL))
			{
				return;
			}

			// Apply freeze mode.
			if ((level.flags2 & LEVEL2_FROZEN) && (player == NULL || player->timefreezer == 0))
			{
				return;
			}
		}


		if (effects & FX_ROCKET) 
		{
			if (++smokecounter == 4)
			{
				// add some smoke behind the rocket 
				smokecounter = 0;
				AActor *th = Spawn("RocketSmokeTrail", Vec3Offset(-Vel), ALLOW_REPLACE);
				if (th)
				{
					th->tics -= pr_rockettrail()&3;
					if (th->tics < 1) th->tics = 1;
					if (!(cl_rockettrails & 2)) th->renderflags |= RF_INVISIBLE;
				}
			}
		}
		else if (effects & FX_GRENADE) 
		{
			if (++smokecounter == 8)
			{
				smokecounter = 0;
				DAngle moveangle = Vel.Angle();
				double xo = -moveangle.Cos() * radius * 2 + pr_rockettrail() / 64.;
				double yo = -moveangle.Sin() * radius * 2 + pr_rockettrail() / 64.;
				double zo = -Height * Vel.Z / 8. + Height * (2 / 3.);
				AActor * th = Spawn("GrenadeSmokeTrail", Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
				if (th)
				{
					th->tics -= pr_rockettrail()&3;
					if (th->tics < 1) th->tics = 1;
					if (!(cl_rockettrails & 2)) th->renderflags |= RF_INVISIBLE;
				}
			}
		}

		double oldz = Z();

		// [RH] Give the pain elemental vertical friction
		// This used to be in APainElemental::Tick but in order to use
		// A_PainAttack with other monsters it has to be here
		if (flags4 & MF4_VFRICTION)
		{
			if (health >0)
			{
				if (fabs (Vel.Z) < 0.25)
				{
					Vel.Z = 0;
					flags4 &= ~MF4_VFRICTION;
				}
				else
				{
					Vel.Z *= (0xe800 / 65536.);
				}
			}
		}

		// [RH] Pulse in and out of visibility
		if (effects & FX_VISIBILITYPULSE)
		{
			if (visdir > 0)
			{
				Alpha += 1/32.;
				if (Alpha >= 1.)
				{
					Alpha = 1.;
					visdir = -1;
				}
			}
			else
			{
				Alpha -= 1/32.;
				if (Alpha <= 0.25)
				{
					Alpha = 0.25;
					visdir = 1;
				}
			}
		}
		else if (flags & MF_STEALTH)
		{
			// [RH] Fade a stealth monster in and out of visibility
			RenderStyle.Flags &= ~STYLEF_Alpha1;
			if (visdir > 0)
			{
				Alpha += 2./TICRATE;
				if (Alpha > 1.)
				{
					Alpha = 1.;
					visdir = 0;
				}
			}
			else if (visdir < 0)
			{
				Alpha -= 1.5/TICRATE;
				if (Alpha < 0)
				{
					Alpha = 0;
					visdir = 0;
				}
			}
		}

		if (bglobal.botnum && !demoplayback &&
			((flags & (MF_SPECIAL|MF_MISSILE)) || (flags3 & MF3_ISMONSTER)))
		{
			bglobal.BotTick(this);
		}

		// [RH] Consider carrying sectors here
		DVector2 cumm(0, 0);
		if ((level.Scrolls.Size() != 0 || player != NULL) && !(flags & MF_NOCLIP) && !(flags & MF_NOSECTOR))
		{
			double height, waterheight;	// killough 4/4/98: add waterheight
			const msecnode_t *node;
			int countx, county;

			// killough 3/7/98: Carry things on floor
			// killough 3/20/98: use new sector list which reflects true members
			// killough 3/27/98: fix carrier bug
			// killough 4/4/98: Underwater, carry things even w/o gravity

			// Move objects only if on floor or underwater,
			// non-floating, and clipped.

			countx = county = 0;

			for (node = touching_sectorlist; node; node = node->m_tnext)
			{
				sector_t *sec = node->m_sector;
				DVector2 scrollv;

				if (level.Scrolls.Size() > unsigned(sec-sectors))
				{
					scrollv = level.Scrolls[sec - sectors];
				}
				else
				{
					scrollv.Zero();
				}

				if (player != NULL)
				{
					int scrolltype = sec->special;

					if (scrolltype >= Scroll_North_Slow &&
						scrolltype <= Scroll_SouthWest_Fast)
					{ // Hexen scroll special
						scrolltype -= Scroll_North_Slow;
						if (i_compatflags&COMPATF_RAVENSCROLL)
						{
							scrollv.X -= HexenCompatSpeeds[HexenScrollies[scrolltype][0]+4] * (1. / (32 * CARRYFACTOR));
							scrollv.Y += HexenCompatSpeeds[HexenScrollies[scrolltype][1]+4] * (1. / (32 * CARRYFACTOR));

						}
						else
						{
							// Use speeds that actually match the scrolling textures!
							scrollv.X -= HexenScrollies[scrolltype][0] * 0.5;
							scrollv.Y += HexenScrollies[scrolltype][1] * 0.5;
						}
					}
					else if (scrolltype >= Carry_East5 &&
							 scrolltype <= Carry_West35)
					{ // Heretic scroll special
						scrolltype -= Carry_East5;
						BYTE dir = HereticScrollDirs[scrolltype / 5];
						double carryspeed = HereticSpeedMuls[scrolltype % 5] * (1. / (32 * CARRYFACTOR));
						if (scrolltype < 5 && !(i_compatflags&COMPATF_RAVENSCROLL)) 
						{
							// Use speeds that actually match the scrolling textures!
							carryspeed = (1 << ((scrolltype % 5) + 15)) / 65536.;
						}
						scrollv.X += carryspeed * ((dir & 3) - 1);
						scrollv.Y += carryspeed * (((dir & 12) >> 2) - 1);
					}
					else if (scrolltype == dScroll_EastLavaDamage)
					{ // Special Heretic scroll special
						if (i_compatflags&COMPATF_RAVENSCROLL)
						{
							scrollv.X += 28. / (32*CARRYFACTOR);
						}
						else
						{
							// Use a speed that actually matches the scrolling texture!
							scrollv.X += 12. / (32 * CARRYFACTOR);
						}
					}
					else if (scrolltype == Scroll_StrifeCurrent)
					{ // Strife scroll special
						int anglespeed = tagManager.GetFirstSectorTag(sec) - 100;
						double carryspeed = (anglespeed % 10) / (16 * CARRYFACTOR);
						DAngle angle = ((anglespeed / 10) * 45.);
						scrollv += angle.ToVector(carryspeed);
					}
				}

				if (scrollv.isZero())
				{
					continue;
				}
				sector_t *heightsec = sec->GetHeightSec();
				if (flags & MF_NOGRAVITY && heightsec == NULL)
				{
					continue;
				}
				DVector3 pos = PosRelative(sec);
				height = sec->floorplane.ZatPoint (pos);
				double height2 = sec->floorplane.ZatPoint(this);
				if (isAbove(height))
				{
					if (heightsec == NULL)
					{
						continue;
					}

					waterheight = heightsec->floorplane.ZatPoint (pos);
					if (waterheight > height && Z() >= waterheight)
					{
						continue;
					}
				}

				cumm += scrollv;
				if (scrollv.X) countx++;
				if (scrollv.Y) county++;
			}

			// Some levels designed with Boom in mind actually want things to accelerate
			// at neighboring scrolling sector boundaries. But it is only important for
			// non-player objects.
			if (player != NULL || !(i_compatflags & COMPATF_BOOMSCROLL))
			{
				if (countx > 1)
				{
					cumm.X /= countx;
				}
				if (county > 1)
				{
					cumm.Y /= county;
				}
			}
		}

		// [RH] If standing on a steep slope, fall down it
		if ((flags & MF_SOLID) && !(flags & (MF_NOCLIP|MF_NOGRAVITY)) &&
			!(flags & MF_NOBLOCKMAP) &&
			Vel.Z <= 0 &&
			floorz == Z())
		{
			secplane_t floorplane;

			// Check 3D floors as well
			floorplane = P_FindFloorPlane(floorsector, PosAtZ(floorz));

			if (floorplane.fC() < STEEPSLOPE &&
				floorplane.ZatPoint (PosRelative(floorsector)) <= floorz)
			{
				const msecnode_t *node;
				bool dopush = true;

				if (floorplane.fC() > STEEPSLOPE*2/3)
				{
					for (node = touching_sectorlist; node; node = node->m_tnext)
					{
						const sector_t *sec = node->m_sector;
						if (sec->floorplane.fC() >= STEEPSLOPE)
						{
							if (floorplane.ZatPoint(PosRelative(node->m_sector)) >= Z() - MaxStepHeight)
							{
								dopush = false;
								break;
							}
						}
					}
				}
				if (dopush)
				{
					Vel += floorplane.Normal().XY();
				}
			}
		}

		// [RH] Missiles moving perfectly vertical need some X/Y movement, or they
		// won't hurt anything. Don't do this if damage is 0! That way, you can
		// still have missiles that go straight up and down through actors without
		// damaging anything.
		// (for backwards compatibility this must check for lack of damage function, not for zero damage!)
		if ((flags & MF_MISSILE) && Vel.X == 0 && Vel.Y == 0 && !IsZeroDamage())
		{
			Vel.X = MinVel;
		}

		// Handle X and Y velocities
		BlockingMobj = NULL;
		double oldfloorz = P_XYMovement (this, cumm);
		if (ObjectFlags & OF_EuthanizeMe)
		{ // actor was destroyed
			return;
		}
		if (Vel.X == 0 && Vel.Y == 0) // Actors at rest
		{
			if (flags2 & MF2_BLASTED)
			{ // Reset to not blasted when velocities are gone
				flags2 &= ~MF2_BLASTED;
			}
			if ((flags6 & MF6_TOUCHY) && !IsSentient())
			{ // Arm a mine which has come to rest
				flags6 |= MF6_ARMED;
			}

		}
		if (Vel.Z != 0 || BlockingMobj || Z() != floorz)
		{	// Handle Z velocity and gravity
			if (((flags2 & MF2_PASSMOBJ) || (flags & MF_SPECIAL)) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
			{
				if (!(onmo = P_CheckOnmobj (this)))
				{
					P_ZMovement (this, oldfloorz);
					flags2 &= ~MF2_ONMOBJ;
				}
				else
				{
					if (player)
					{
						if (Vel.Z < level.gravity * Sector->gravity * (-1./100)// -655.36f)
							&& !(flags&MF_NOGRAVITY))
						{
							PlayerLandedOnThing (this, onmo);
						}
					}
					if (onmo->Top() - Z() <= MaxStepHeight)
					{
						if (player && player->mo == this)
						{
							player->viewheight -= onmo->Top() - Z();
							double deltaview = player->GetDeltaViewHeight();
							if (deltaview > player->deltaviewheight)
							{
								player->deltaviewheight = deltaview;
							}
						} 
						SetZ(onmo->Top());
					}
					// Check for MF6_BUMPSPECIAL
					// By default, only players can activate things by bumping into them
					// We trigger specials as long as we are on top of it and not just when
					// we land on it. This could be considered as gravity making us continually
					// bump into it, but it also avoids having to worry about walking on to
					// something without dropping and not triggering anything.
					if ((onmo->flags6 & MF6_BUMPSPECIAL) && ((player != NULL)
						|| ((onmo->activationtype & THINGSPEC_MonsterTrigger) && (flags3 & MF3_ISMONSTER))
						|| ((onmo->activationtype & THINGSPEC_MissileTrigger) && (flags & MF_MISSILE))
						) && (level.maptime > onmo->lastbump)) // Leave the bumper enough time to go away
					{
						if (player == NULL || !(player->cheats & CF_PREDICTING))
						{
							if (P_ActivateThingSpecial(onmo, this))
								onmo->lastbump = level.maptime + TICRATE;
						}
					}
					if (Vel.Z != 0 && (BounceFlags & BOUNCE_Actors))
					{
						P_BounceActor(this, onmo, true);
					}
					else
					{
						flags2 |= MF2_ONMOBJ;
						Vel.Z = 0;
						Crash();
					}
				}
			}
			else
			{
				P_ZMovement (this, oldfloorz);
			}

			if (ObjectFlags & OF_EuthanizeMe)
				return;		// actor was destroyed
		}
		else if (Z() <= floorz)
		{
			Crash();
			if (ObjectFlags & OF_EuthanizeMe)
				return;		// actor was destroyed
		}

		CheckPortalTransition(true);

		UpdateWaterLevel ();

		// [RH] Don't advance if predicting a player
		if (player && (player->cheats & CF_PREDICTING))
		{
			return;
		}

		// Check for poison damage, but only once per PoisonPeriod tics (or once per second if none).
		if (PoisonDurationReceived && (level.time % (PoisonPeriodReceived ? PoisonPeriodReceived : TICRATE) == 0))
		{
			P_DamageMobj(this, NULL, Poisoner, PoisonDamageReceived, PoisonDamageTypeReceived ? PoisonDamageTypeReceived : (FName)NAME_Poison, 0);

			--PoisonDurationReceived;

			// Must clear damage when duration is done, otherwise it
			// could be added to with ADDITIVEPOISONDAMAGE.
			if (!PoisonDurationReceived) PoisonDamageReceived = 0;
		}
	}

	assert (state != NULL);
	if (state == NULL)
	{
		Destroy();
		return;
	}
	if (!CheckNoDelay())
		return; // freed itself
	// cycle through states, calling action functions at transitions

	UpdateRenderSectorList();

	if (tics != -1)
	{
		// [RH] Use tics <= 0 instead of == 0 so that spawnstates
		// of 0 tics work as expected.
		if (--tics <= 0)
		{
			if (!SetState(state->GetNextState()))
				return; 		// freed itself
		}
	}
	else
	{
		int respawn_monsters = G_SkillProperty(SKILLP_Respawn);
		// check for nightmare respawn
		if (!(flags5 & MF5_ALWAYSRESPAWN))
		{
			if (!respawn_monsters || !(flags3 & MF3_ISMONSTER) || (flags2 & MF2_DORMANT) || (flags5 & MF5_NEVERRESPAWN))
				return;

			int limit = G_SkillProperty (SKILLP_RespawnLimit);
			if (limit > 0 && skillrespawncount >= limit)
				return;
		}

		movecount++;

		if (movecount < respawn_monsters)
			return;

		if (level.time & 31)
			return;

		if (pr_nightmarerespawn() > 4)
			return;

		P_NightmareRespawn (this);
	}
}